

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O3

int Abc_TtCofactorPermNaive(word *pTruth,int i,int nWords,int fSwapOnly)

{
  ulong uVar1;
  word wVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  uint *pTruthU;
  word *pwVar6;
  word *pwVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  word *pwVar18;
  uint uVar19;
  uint uVar20;
  word *pwVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  
  uVar16 = (ulong)(uint)nWords;
  bVar8 = (byte)i;
  if (fSwapOnly != 0) {
    uVar24 = uVar16;
    if (0 < nWords) {
      lVar13 = 0;
      pwVar6 = Abc_TtCofactorPermNaive::pCopy;
      do {
        *(undefined8 *)((long)Abc_TtCofactorPermNaive::pCopy + lVar13) =
             *(undefined8 *)((long)pTruth + lVar13);
        lVar13 = lVar13 + 8;
      } while (uVar16 * 8 - lVar13 != 0);
      if (i < 5) {
        uVar15 = s_PMasks[i][0];
        uVar22 = s_PMasks[i][1];
        uVar1 = s_PMasks[i][2];
        lVar13 = 0;
        do {
          uVar23 = *(ulong *)((long)Abc_TtCofactorPermNaive::pCopy + lVar13);
          bVar9 = (byte)(1 << (bVar8 & 0x1f));
          *(ulong *)((long)Abc_TtCofactorPermNaive::pCopy + lVar13) =
               (uVar23 & uVar1) >> (bVar9 & 0x3f) |
               (uVar23 & uVar22) << (bVar9 & 0x3f) | uVar23 & uVar15;
          lVar13 = lVar13 + 8;
        } while (uVar16 * 8 - lVar13 != 0);
      }
      else if (i == 5) {
        pwVar6 = Abc_TtCofactorPermNaive::pCopy;
        do {
          *(ulong *)((long)pwVar6 + 4) =
               CONCAT44((int)*(undefined8 *)((long)pwVar6 + 4),
                        (int)((ulong)*(undefined8 *)((long)pwVar6 + 4) >> 0x20));
          pwVar6 = pwVar6 + 2;
        } while (pwVar6 < Abc_TtCofactorPermNaive::pCopy + uVar16);
      }
      else {
        uVar15 = (ulong)(uint)(1 << (bVar8 - 6 & 0x1f));
        if ((uint)i < 7) {
          uVar15 = 1;
        }
        iVar17 = (int)uVar15;
        iVar11 = iVar17 * 4;
        pwVar7 = Abc_TtCofactorPermNaive::pCopy + (uint)(iVar17 * 2);
        pwVar18 = Abc_TtCofactorPermNaive::pCopy + uVar15;
        do {
          if (0 < iVar17) {
            uVar22 = 0;
            do {
              wVar2 = pwVar18[uVar22];
              pwVar18[uVar22] = pwVar7[uVar22];
              pwVar7[uVar22] = wVar2;
              uVar22 = uVar22 + 1;
            } while (uVar15 != uVar22);
          }
          pwVar6 = pwVar6 + iVar11;
          pwVar7 = pwVar7 + iVar11;
          pwVar18 = pwVar18 + iVar11;
        } while (pwVar6 < Abc_TtCofactorPermNaive::pCopy + uVar16);
      }
    }
    do {
      if ((int)uVar24 < 1) {
        return 0;
      }
      uVar15 = pTruth[uVar24 - 1];
      uVar22 = Abc_TtCofactorTest10::pCopy2[uVar24 + 0x3ff];
      uVar24 = uVar24 - 1;
    } while (uVar15 == uVar22);
    iVar17 = (uint)(uVar22 <= uVar15) << 2;
    if (0 < nWords) {
      if (uVar22 <= uVar15) {
        lVar13 = 0;
        do {
          *(undefined8 *)((long)pTruth + lVar13) =
               *(undefined8 *)((long)Abc_TtCofactorPermNaive::pCopy + lVar13);
          lVar13 = lVar13 + 8;
        } while (uVar16 * 8 - lVar13 != 0);
        return 4;
      }
      return iVar17;
    }
    return iVar17;
  }
  if (nWords < 1) {
LAB_004fd2a8:
    bVar5 = false;
    uVar24 = uVar16;
  }
  else {
    lVar13 = uVar16 * 8;
    lVar14 = 0;
    pwVar6 = Abc_TtCofactorPermNaive::pCopy_1;
    do {
      *(undefined8 *)((long)Abc_TtCofactorPermNaive::pCopy_1 + lVar14) =
           *(undefined8 *)((long)pTruth + lVar14);
      lVar14 = lVar14 + 8;
    } while (lVar13 - lVar14 != 0);
    lVar14 = 0;
    do {
      *(undefined8 *)((long)Abc_TtCofactorPermNaive::pBest + lVar14) =
           *(undefined8 *)((long)pTruth + lVar14);
      lVar14 = lVar14 + 8;
    } while (lVar13 - lVar14 != 0);
    if (nWords != 1) {
      if (i < 6) {
        uVar24 = s_Truths6[i];
        lVar14 = 0;
        do {
          bVar9 = (byte)(1 << (bVar8 & 0x1f));
          *(ulong *)((long)Abc_TtCofactorPermNaive::pCopy_1 + lVar14) =
               (*(ulong *)((long)Abc_TtCofactorPermNaive::pCopy_1 + lVar14) & uVar24) >>
               (bVar9 & 0x3f) |
               *(ulong *)((long)Abc_TtCofactorPermNaive::pCopy_1 + lVar14) << (bVar9 & 0x3f) &
               uVar24;
          lVar14 = lVar14 + 8;
        } while (lVar13 - lVar14 != 0);
      }
      else {
        bVar9 = (byte)(i + -6);
        uVar19 = 1 << (bVar9 & 0x1f);
        iVar17 = 2 << (bVar9 & 0x1f);
        uVar24 = 1;
        if (1 < (int)uVar19) {
          uVar24 = (ulong)uVar19;
        }
        pwVar7 = Abc_TtCofactorPermNaive::pCopy_1 + (int)uVar19;
        do {
          if (i + -6 != 0x1f) {
            uVar15 = 0;
            do {
              wVar2 = pwVar6[uVar15];
              pwVar6[uVar15] = pwVar7[uVar15];
              pwVar7[uVar15] = wVar2;
              uVar15 = uVar15 + 1;
            } while (uVar24 != uVar15);
          }
          pwVar6 = pwVar6 + iVar17;
          pwVar7 = pwVar7 + iVar17;
        } while (pwVar6 < Abc_TtCofactorPermNaive::pCopy_1 + uVar16);
      }
      goto LAB_004fd2a8;
    }
    bVar9 = (byte)(1 << (bVar8 & 0x1f));
    Abc_TtCofactorPermNaive::pCopy_1[0] =
         (s_Truths6[i] & Abc_TtCofactorPermNaive::pCopy_1[0]) >> (bVar9 & 0x3f) |
         Abc_TtCofactorPermNaive::pCopy_1[0] << (bVar9 & 0x3f) & s_Truths6[i];
    bVar5 = true;
    uVar24 = 1;
  }
  pwVar6 = Abc_TtCofactorPermNaive::pCopy_1;
  uVar15 = uVar24;
  do {
    if ((int)uVar15 < 1) {
      uVar19 = 0;
      goto LAB_004fd30a;
    }
    uVar22 = Abc_TtCofactorPermNaive::pCopy_1[uVar15 + 0x3ff];
    uVar1 = Abc_TtCofactorPermNaive::pCopy[uVar15 + 0x3ff];
    uVar15 = uVar15 - 1;
  } while (uVar22 == uVar1);
  uVar19 = (uint)(uVar1 <= uVar22);
  if ((0 < nWords) && (uVar1 <= uVar22)) {
    memcpy(Abc_TtCofactorPermNaive::pBest,Abc_TtCofactorPermNaive::pCopy_1,uVar24 * 8);
    uVar19 = 1;
  }
LAB_004fd30a:
  iVar17 = i + 1;
  bVar9 = (byte)iVar17;
  if (bVar5) {
    bVar10 = (byte)(1 << (bVar9 & 0x1f));
    Abc_TtCofactorPermNaive::pCopy_1[0] =
         (s_Truths6[iVar17] & Abc_TtCofactorPermNaive::pCopy_1[0]) >> (bVar10 & 0x3f) |
         Abc_TtCofactorPermNaive::pCopy_1[0] << (bVar10 & 0x3f) & s_Truths6[iVar17];
  }
  else if (i < 5) {
    if (0 < nWords) {
      uVar15 = s_Truths6[iVar17];
      pwVar6 = Abc_TtCofactorPermNaive::pCopy_1;
      uVar22 = uVar24;
      do {
        bVar10 = (byte)(1 << (bVar9 & 0x1f));
        *pwVar6 = (*pwVar6 & uVar15) >> (bVar10 & 0x3f) | *pwVar6 << (bVar10 & 0x3f) & uVar15;
        pwVar6 = pwVar6 + 1;
        uVar22 = uVar22 - 1;
      } while (uVar22 != 0);
    }
  }
  else if (0 < nWords) {
    bVar10 = (byte)(i + -5);
    uVar20 = 1 << (bVar10 & 0x1f);
    iVar11 = 2 << (bVar10 & 0x1f);
    uVar15 = 1;
    if (1 < (int)uVar20) {
      uVar15 = (ulong)uVar20;
    }
    pwVar7 = Abc_TtCofactorPermNaive::pCopy_1 + (int)uVar20;
    do {
      if (i + -5 != 0x1f) {
        uVar22 = 0;
        do {
          wVar2 = pwVar6[uVar22];
          pwVar6[uVar22] = pwVar7[uVar22];
          pwVar7[uVar22] = wVar2;
          uVar22 = uVar22 + 1;
        } while (uVar15 != uVar22);
      }
      pwVar6 = pwVar6 + iVar11;
      pwVar7 = pwVar7 + iVar11;
    } while (pwVar6 < Abc_TtCofactorPermNaive::pCopy_1 + nWords);
  }
  pwVar6 = Abc_TtCofactorPermNaive::pCopy_1;
  uVar15 = uVar24;
  do {
    if ((int)uVar15 < 1) goto LAB_004fd46b;
    uVar22 = Abc_TtCofactorPermNaive::pCopy_1[uVar15 + 0x3ff];
    uVar1 = Abc_TtCofactorPermNaive::pCopy[uVar15 + 0x3ff];
    uVar15 = uVar15 - 1;
  } while (uVar22 == uVar1);
  uVar20 = 3;
  if (uVar22 < uVar1) {
    uVar20 = uVar19;
  }
  uVar19 = uVar20;
  if ((0 < nWords) && (uVar1 <= uVar22)) {
    memcpy(Abc_TtCofactorPermNaive::pBest,Abc_TtCofactorPermNaive::pCopy_1,uVar24 * 8);
    uVar19 = 3;
  }
LAB_004fd46b:
  if (bVar5) {
    bVar10 = (byte)(1 << (bVar8 & 0x1f));
    Abc_TtCofactorPermNaive::pCopy_1[0] =
         (s_Truths6[i] & Abc_TtCofactorPermNaive::pCopy_1[0]) >> (bVar10 & 0x3f) |
         Abc_TtCofactorPermNaive::pCopy_1[0] << (bVar10 & 0x3f) & s_Truths6[i];
  }
  else if (i < 6) {
    if (0 < nWords) {
      uVar15 = s_Truths6[i];
      pwVar6 = Abc_TtCofactorPermNaive::pCopy_1;
      uVar22 = uVar24;
      do {
        bVar10 = (byte)(1 << (bVar8 & 0x1f));
        *pwVar6 = (*pwVar6 & uVar15) >> (bVar10 & 0x3f) | *pwVar6 << (bVar10 & 0x3f) & uVar15;
        pwVar6 = pwVar6 + 1;
        uVar22 = uVar22 - 1;
      } while (uVar22 != 0);
    }
  }
  else if (0 < nWords) {
    bVar10 = (byte)(i + -6);
    uVar20 = 1 << (bVar10 & 0x1f);
    iVar11 = 2 << (bVar10 & 0x1f);
    uVar15 = 1;
    if (1 < (int)uVar20) {
      uVar15 = (ulong)uVar20;
    }
    pwVar7 = Abc_TtCofactorPermNaive::pCopy_1 + (int)uVar20;
    do {
      if (i + -6 != 0x1f) {
        uVar22 = 0;
        do {
          wVar2 = pwVar6[uVar22];
          pwVar6[uVar22] = pwVar7[uVar22];
          pwVar7[uVar22] = wVar2;
          uVar22 = uVar22 + 1;
        } while (uVar15 != uVar22);
      }
      pwVar6 = pwVar6 + iVar11;
      pwVar7 = pwVar7 + iVar11;
    } while (pwVar6 < Abc_TtCofactorPermNaive::pCopy_1 + nWords);
  }
  pwVar6 = Abc_TtCofactorPermNaive::pCopy_1;
  uVar15 = uVar24;
  do {
    if ((int)uVar15 < 1) goto LAB_004fd590;
    lVar13 = uVar15 + 0x3ff;
    lVar14 = uVar15 + 0x3ff;
    uVar15 = uVar15 - 1;
  } while (Abc_TtCofactorPermNaive::pCopy_1[lVar14] == Abc_TtCofactorPermNaive::pCopy[lVar13]);
  if (Abc_TtCofactorPermNaive::pCopy_1[lVar14] < Abc_TtCofactorPermNaive::pCopy[lVar13]) {
LAB_004fd590:
    uVar20 = uVar19;
    if (i < 5) {
      if (0 < nWords) {
LAB_004fd5f2:
        uVar15 = s_PMasks[i][0];
        uVar22 = s_PMasks[i][1];
        uVar1 = s_PMasks[i][2];
        pwVar6 = Abc_TtCofactorPermNaive::pCopy_1;
        uVar23 = uVar24;
        do {
          uVar3 = *pwVar6;
          bVar10 = (byte)(1 << (bVar8 & 0x1f));
          *pwVar6 = (uVar3 & uVar1) >> (bVar10 & 0x3f) |
                    (uVar3 & uVar22) << (bVar10 & 0x3f) | uVar3 & uVar15;
          pwVar6 = pwVar6 + 1;
          uVar23 = uVar23 - 1;
          uVar19 = uVar20;
        } while (uVar23 != 0);
      }
      bVar4 = true;
    }
    else {
      pwVar7 = Abc_TtCofactorPermNaive::pCopy_1 + nWords;
      if (i == 5) {
        if (0 < nWords) goto LAB_004fd686;
      }
      else if (0 < nWords) {
LAB_004fd6ae:
        uVar15 = (ulong)(uint)(1 << (bVar8 - 6 & 0x1f));
        if ((uint)i < 7) {
          uVar15 = 1;
        }
        iVar11 = (int)uVar15;
        iVar12 = iVar11 * 4;
        pwVar18 = Abc_TtCofactorPermNaive::pCopy_1 + (uint)(iVar11 * 2);
        pwVar21 = Abc_TtCofactorPermNaive::pCopy_1 + uVar15;
        do {
          if (0 < iVar11) {
            uVar22 = 0;
            do {
              wVar2 = pwVar21[uVar22];
              pwVar21[uVar22] = pwVar18[uVar22];
              pwVar18[uVar22] = wVar2;
              uVar22 = uVar22 + 1;
            } while (uVar15 != uVar22);
          }
          pwVar6 = pwVar6 + iVar12;
          pwVar18 = pwVar18 + iVar12;
          pwVar21 = pwVar21 + iVar12;
        } while (pwVar6 < pwVar7);
        bVar4 = false;
        goto LAB_004fd71f;
      }
LAB_004fd6a5:
      bVar4 = false;
    }
  }
  else {
    if (0 < nWords) {
      memcpy(Abc_TtCofactorPermNaive::pBest,Abc_TtCofactorPermNaive::pCopy_1,uVar24 * 8);
      uVar20 = 2;
      uVar19 = 2;
      if (i < 5) goto LAB_004fd5f2;
      pwVar7 = Abc_TtCofactorPermNaive::pCopy_1 + uVar16;
      if (i != 5) goto LAB_004fd6ae;
LAB_004fd686:
      uVar19 = uVar20;
      pwVar6 = Abc_TtCofactorPermNaive::pCopy_1;
      do {
        *(ulong *)((long)pwVar6 + 4) =
             CONCAT44((int)*(undefined8 *)((long)pwVar6 + 4),
                      (int)((ulong)*(undefined8 *)((long)pwVar6 + 4) >> 0x20));
        pwVar6 = pwVar6 + 2;
      } while (pwVar6 < pwVar7);
      goto LAB_004fd6a5;
    }
    bVar4 = i < 5;
    uVar19 = 2;
  }
LAB_004fd71f:
  pwVar6 = Abc_TtCofactorPermNaive::pCopy_1;
  uVar15 = uVar24;
  do {
    if ((int)uVar15 < 1) goto LAB_004fd774;
    uVar22 = Abc_TtCofactorPermNaive::pCopy_1[uVar15 + 0x3ff];
    uVar1 = Abc_TtCofactorPermNaive::pCopy[uVar15 + 0x3ff];
    uVar15 = uVar15 - 1;
  } while (uVar22 == uVar1);
  uVar20 = 6;
  if (uVar22 < uVar1) {
    uVar20 = uVar19;
  }
  uVar19 = uVar20;
  if ((0 < nWords) && (uVar1 <= uVar22)) {
    memcpy(Abc_TtCofactorPermNaive::pBest,Abc_TtCofactorPermNaive::pCopy_1,uVar24 * 8);
    uVar19 = 6;
  }
LAB_004fd774:
  if (bVar5) {
    bVar10 = (byte)(1 << (bVar9 & 0x1f));
    Abc_TtCofactorPermNaive::pCopy_1[0] =
         (s_Truths6[iVar17] & Abc_TtCofactorPermNaive::pCopy_1[0]) >> (bVar10 & 0x3f) |
         Abc_TtCofactorPermNaive::pCopy_1[0] << (bVar10 & 0x3f) & s_Truths6[iVar17];
  }
  else if (i < 5) {
    if (0 < nWords) {
      uVar15 = s_Truths6[iVar17];
      pwVar6 = Abc_TtCofactorPermNaive::pCopy_1;
      uVar22 = uVar24;
      do {
        bVar10 = (byte)(1 << (bVar9 & 0x1f));
        *pwVar6 = (*pwVar6 & uVar15) >> (bVar10 & 0x3f) | *pwVar6 << (bVar10 & 0x3f) & uVar15;
        pwVar6 = pwVar6 + 1;
        uVar22 = uVar22 - 1;
      } while (uVar22 != 0);
    }
  }
  else if (0 < nWords) {
    bVar10 = (byte)(i + -5);
    uVar20 = 1 << (bVar10 & 0x1f);
    iVar11 = 2 << (bVar10 & 0x1f);
    uVar15 = 1;
    if (1 < (int)uVar20) {
      uVar15 = (ulong)uVar20;
    }
    pwVar7 = Abc_TtCofactorPermNaive::pCopy_1 + (int)uVar20;
    do {
      if (i + -5 != 0x1f) {
        uVar22 = 0;
        do {
          wVar2 = pwVar6[uVar22];
          pwVar6[uVar22] = pwVar7[uVar22];
          pwVar7[uVar22] = wVar2;
          uVar22 = uVar22 + 1;
        } while (uVar15 != uVar22);
      }
      pwVar6 = pwVar6 + iVar11;
      pwVar7 = pwVar7 + iVar11;
    } while (pwVar6 < Abc_TtCofactorPermNaive::pCopy_1 + nWords);
  }
  pwVar6 = Abc_TtCofactorPermNaive::pCopy_1;
  uVar15 = uVar24;
  do {
    if ((int)uVar15 < 1) goto LAB_004fd8d1;
    uVar22 = Abc_TtCofactorPermNaive::pCopy_1[uVar15 + 0x3ff];
    uVar1 = Abc_TtCofactorPermNaive::pCopy[uVar15 + 0x3ff];
    uVar15 = uVar15 - 1;
  } while (uVar22 == uVar1);
  uVar20 = 7;
  if (uVar22 < uVar1) {
    uVar20 = uVar19;
  }
  uVar19 = uVar20;
  if ((0 < nWords) && (uVar1 <= uVar22)) {
    memcpy(Abc_TtCofactorPermNaive::pBest,Abc_TtCofactorPermNaive::pCopy_1,uVar24 * 8);
    uVar19 = 7;
  }
LAB_004fd8d1:
  if (bVar5) {
    bVar10 = (byte)(1 << (bVar8 & 0x1f));
    Abc_TtCofactorPermNaive::pCopy_1[0] =
         (s_Truths6[i] & Abc_TtCofactorPermNaive::pCopy_1[0]) >> (bVar10 & 0x3f) |
         Abc_TtCofactorPermNaive::pCopy_1[0] << (bVar10 & 0x3f) & s_Truths6[i];
  }
  else if (i < 6) {
    if (0 < nWords) {
      uVar15 = s_Truths6[i];
      pwVar6 = Abc_TtCofactorPermNaive::pCopy_1;
      uVar22 = uVar24;
      do {
        bVar10 = (byte)(1 << (bVar8 & 0x1f));
        *pwVar6 = (*pwVar6 & uVar15) >> (bVar10 & 0x3f) | *pwVar6 << (bVar10 & 0x3f) & uVar15;
        pwVar6 = pwVar6 + 1;
        uVar22 = uVar22 - 1;
      } while (uVar22 != 0);
    }
  }
  else if (0 < nWords) {
    bVar10 = (byte)(i + -6);
    uVar20 = 1 << (bVar10 & 0x1f);
    iVar11 = 2 << (bVar10 & 0x1f);
    uVar15 = 1;
    if (1 < (int)uVar20) {
      uVar15 = (ulong)uVar20;
    }
    pwVar7 = Abc_TtCofactorPermNaive::pCopy_1 + (int)uVar20;
    do {
      if (i + -6 != 0x1f) {
        uVar22 = 0;
        do {
          wVar2 = pwVar6[uVar22];
          pwVar6[uVar22] = pwVar7[uVar22];
          pwVar7[uVar22] = wVar2;
          uVar22 = uVar22 + 1;
        } while (uVar15 != uVar22);
      }
      pwVar6 = pwVar6 + iVar11;
      pwVar7 = pwVar7 + iVar11;
    } while (pwVar6 < Abc_TtCofactorPermNaive::pCopy_1 + nWords);
  }
  pwVar6 = Abc_TtCofactorPermNaive::pCopy_1;
  uVar15 = uVar24;
  do {
    if ((int)uVar15 < 1) goto LAB_004fda28;
    uVar22 = Abc_TtCofactorPermNaive::pCopy_1[uVar15 + 0x3ff];
    uVar1 = Abc_TtCofactorPermNaive::pCopy[uVar15 + 0x3ff];
    uVar15 = uVar15 - 1;
  } while (uVar22 == uVar1);
  uVar20 = 5;
  if (uVar22 < uVar1) {
    uVar20 = uVar19;
  }
  uVar19 = uVar20;
  if ((0 < nWords) && (uVar1 <= uVar22)) {
    memcpy(Abc_TtCofactorPermNaive::pBest,Abc_TtCofactorPermNaive::pCopy_1,uVar24 * 8);
    uVar19 = 5;
  }
LAB_004fda28:
  if (bVar5) {
    bVar9 = (byte)(1 << (bVar9 & 0x1f));
    Abc_TtCofactorPermNaive::pCopy_1[0] =
         (s_Truths6[iVar17] & Abc_TtCofactorPermNaive::pCopy_1[0]) >> (bVar9 & 0x3f) |
         Abc_TtCofactorPermNaive::pCopy_1[0] << (bVar9 & 0x3f) & s_Truths6[iVar17];
  }
  else if (i < 5) {
    if (0 < nWords) {
      uVar15 = s_Truths6[iVar17];
      pwVar6 = Abc_TtCofactorPermNaive::pCopy_1;
      uVar22 = uVar24;
      do {
        bVar10 = (byte)(1 << (bVar9 & 0x1f));
        *pwVar6 = (*pwVar6 & uVar15) >> (bVar10 & 0x3f) | *pwVar6 << (bVar10 & 0x3f) & uVar15;
        pwVar6 = pwVar6 + 1;
        uVar22 = uVar22 - 1;
      } while (uVar22 != 0);
    }
  }
  else if (0 < nWords) {
    bVar9 = (byte)(i + -5);
    uVar20 = 1 << (bVar9 & 0x1f);
    iVar17 = 2 << (bVar9 & 0x1f);
    uVar15 = 1;
    if (1 < (int)uVar20) {
      uVar15 = (ulong)uVar20;
    }
    pwVar7 = Abc_TtCofactorPermNaive::pCopy_1 + (int)uVar20;
    do {
      if (i + -5 != 0x1f) {
        uVar22 = 0;
        do {
          wVar2 = pwVar6[uVar22];
          pwVar6[uVar22] = pwVar7[uVar22];
          pwVar7[uVar22] = wVar2;
          uVar22 = uVar22 + 1;
        } while (uVar15 != uVar22);
      }
      pwVar6 = pwVar6 + iVar17;
      pwVar7 = pwVar7 + iVar17;
    } while (pwVar6 < Abc_TtCofactorPermNaive::pCopy_1 + nWords);
  }
  pwVar6 = Abc_TtCofactorPermNaive::pCopy_1;
  uVar15 = uVar24;
  do {
    uVar22 = uVar24;
    if ((int)uVar15 < 1) goto LAB_004fdb53;
    lVar13 = uVar15 + 0x3ff;
    lVar14 = uVar15 + 0x3ff;
    uVar15 = uVar15 - 1;
  } while (Abc_TtCofactorPermNaive::pCopy_1[lVar14] == Abc_TtCofactorPermNaive::pCopy[lVar13]);
  if (Abc_TtCofactorPermNaive::pCopy_1[lVar14] < Abc_TtCofactorPermNaive::pCopy[lVar13]) {
LAB_004fdb53:
    if (bVar4) {
      if (0 < nWords) {
LAB_004fdbb5:
        uVar16 = s_PMasks[i][0];
        uVar15 = s_PMasks[i][1];
        uVar1 = s_PMasks[i][2];
        pwVar6 = Abc_TtCofactorPermNaive::pCopy_1;
        uVar23 = uVar24;
        do {
          uVar3 = *pwVar6;
          bVar9 = (byte)(1 << (bVar8 & 0x1f));
          *pwVar6 = (uVar3 & uVar1) >> (bVar9 & 0x3f) |
                    (uVar3 & uVar15) << (bVar9 & 0x3f) | uVar3 & uVar16;
          pwVar6 = pwVar6 + 1;
          uVar23 = uVar23 - 1;
        } while (uVar23 != 0);
        goto LAB_004fdcc9;
      }
    }
    else {
      pwVar7 = Abc_TtCofactorPermNaive::pCopy_1 + nWords;
      if (i == 5) {
        if (0 < nWords) goto LAB_004fdc46;
      }
      else if (0 < nWords) {
LAB_004fdc67:
        uVar16 = (ulong)(uint)(1 << (bVar8 - 6 & 0x1f));
        if ((uint)i < 7) {
          uVar16 = 1;
        }
        iVar17 = (int)uVar16;
        iVar11 = iVar17 * 4;
        pwVar18 = Abc_TtCofactorPermNaive::pCopy_1 + (uint)(iVar17 * 2);
        pwVar21 = Abc_TtCofactorPermNaive::pCopy_1 + uVar16;
        do {
          if (0 < iVar17) {
            uVar15 = 0;
            do {
              wVar2 = pwVar21[uVar15];
              pwVar21[uVar15] = pwVar18[uVar15];
              pwVar18[uVar15] = wVar2;
              uVar15 = uVar15 + 1;
            } while (uVar16 != uVar15);
          }
          pwVar6 = pwVar6 + iVar11;
          pwVar18 = pwVar18 + iVar11;
          pwVar21 = pwVar21 + iVar11;
        } while (pwVar6 < pwVar7);
        goto LAB_004fdcc9;
      }
    }
  }
  else {
    if (nWords < 1) {
      uVar19 = 4;
      goto LAB_004fdcf3;
    }
    memcpy(Abc_TtCofactorPermNaive::pBest,Abc_TtCofactorPermNaive::pCopy_1,uVar24 * 8);
    uVar19 = 4;
    if (bVar4) goto LAB_004fdbb5;
    pwVar7 = Abc_TtCofactorPermNaive::pCopy_1 + uVar16;
    uVar19 = 4;
    if (i != 5) goto LAB_004fdc67;
LAB_004fdc46:
    pwVar6 = Abc_TtCofactorPermNaive::pCopy_1;
    do {
      *(ulong *)((long)pwVar6 + 4) =
           CONCAT44((int)*(undefined8 *)((long)pwVar6 + 4),
                    (int)((ulong)*(undefined8 *)((long)pwVar6 + 4) >> 0x20));
      pwVar6 = pwVar6 + 2;
    } while (pwVar6 < pwVar7);
LAB_004fdcc9:
    if (0 < nWords) {
      lVar13 = 0;
      uVar16 = uVar24;
      do {
        if (*(long *)((long)pTruth + lVar13) !=
            *(long *)((long)Abc_TtCofactorPermNaive::pCopy_1 + lVar13)) {
          __assert_fail("Abc_TtEqual( pTruth, pCopy, nWords )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                        ,0x356,"int Abc_TtCofactorPermNaive(word *, int, int, int)");
        }
        lVar13 = lVar13 + 8;
        uVar16 = uVar16 - 1;
      } while (uVar16 != 0);
    }
  }
  if (uVar19 == 0) {
    return 0;
  }
LAB_004fdcf3:
  do {
    if ((int)uVar22 < 1) goto LAB_004fdd36;
    lVar14 = uVar22 + 0x3ff;
    lVar13 = uVar22 - 1;
    uVar22 = uVar22 - 1;
  } while (pTruth[lVar13] == Abc_TtCofactorPermNaive::pCopy_1[lVar14]);
  if (Abc_TtCofactorPermNaive::pCopy_1[lVar14] <= pTruth[lVar13]) {
    if (0 < nWords) {
      lVar13 = 0;
      do {
        *(undefined8 *)((long)pTruth + lVar13) =
             *(undefined8 *)((long)Abc_TtCofactorPermNaive::pBest + lVar13);
        lVar13 = lVar13 + 8;
        uVar24 = uVar24 - 1;
      } while (uVar24 != 0);
    }
    return uVar19;
  }
LAB_004fdd36:
  __assert_fail("Abc_TtCompareRev(pTruth, pBest, nWords) == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                ,0x359,"int Abc_TtCofactorPermNaive(word *, int, int, int)");
}

Assistant:

int Abc_TtCofactorPermNaive( word * pTruth, int i, int nWords, int fSwapOnly )
{
    if ( fSwapOnly )
    {
        static word pCopy[1024];
        Abc_TtCopy( pCopy, pTruth, nWords, 0 );
        Abc_TtSwapAdjacent( pCopy, nWords, i );
        if ( Abc_TtCompareRev(pTruth, pCopy, nWords) == 1 )
        {
            Abc_TtCopy( pTruth, pCopy, nWords, 0 );
            return 4;
        }
        return 0;
    }
    {
        static word pCopy[1024];
        static word pBest[1024];
        int Config = 0;
        // save two copies
        Abc_TtCopy( pCopy, pTruth, nWords, 0 );
        Abc_TtCopy( pBest, pTruth, nWords, 0 );
        // PXY
        // 001
        Abc_TtFlip( pCopy, nWords, i );
        if ( Abc_TtCompareRev(pBest, pCopy, nWords) == 1 )
            Abc_TtCopy( pBest, pCopy, nWords, 0 ), Config = 1;
        // PXY
        // 011
        Abc_TtFlip( pCopy, nWords, i+1 );
        if ( Abc_TtCompareRev(pBest, pCopy, nWords) == 1 )
            Abc_TtCopy( pBest, pCopy, nWords, 0 ), Config = 3;
        // PXY
        // 010
        Abc_TtFlip( pCopy, nWords, i );
        if ( Abc_TtCompareRev(pBest, pCopy, nWords) == 1 )
            Abc_TtCopy( pBest, pCopy, nWords, 0 ), Config = 2;
        // PXY
        // 110
        Abc_TtSwapAdjacent( pCopy, nWords, i );
        if ( Abc_TtCompareRev(pBest, pCopy, nWords) == 1 )
            Abc_TtCopy( pBest, pCopy, nWords, 0 ), Config = 6;
        // PXY
        // 111
        Abc_TtFlip( pCopy, nWords, i+1 );
        if ( Abc_TtCompareRev(pBest, pCopy, nWords) == 1 )
            Abc_TtCopy( pBest, pCopy, nWords, 0 ), Config = 7;
        // PXY
        // 101
        Abc_TtFlip( pCopy, nWords, i );
        if ( Abc_TtCompareRev(pBest, pCopy, nWords) == 1 )
            Abc_TtCopy( pBest, pCopy, nWords, 0 ), Config = 5;
        // PXY
        // 100
        Abc_TtFlip( pCopy, nWords, i+1 );
        if ( Abc_TtCompareRev(pBest, pCopy, nWords) == 1 )
            Abc_TtCopy( pBest, pCopy, nWords, 0 ), Config = 4;
        // PXY
        // 000
        Abc_TtSwapAdjacent( pCopy, nWords, i );
        assert( Abc_TtEqual( pTruth, pCopy, nWords ) );
        if ( Config == 0 )
            return 0;
        assert( Abc_TtCompareRev(pTruth, pBest, nWords) == 1 );
        Abc_TtCopy( pTruth, pBest, nWords, 0 );
        return Config;
    }
}